

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void http_bad_request(http_client_t *client,unsigned_long code,char *comment,char *msg)

{
  int iVar1;
  char buf [256];
  char acStack_118 [264];
  
  iVar1 = snprintf(acStack_118,0x100,"HTTP/1.0 %lu %s\r\nConnection: close\r\n\r\n%s\r\n",code,
                   comment,msg);
  write(client->fd,acStack_118,(long)iVar1);
  return;
}

Assistant:

void http_bad_request(http_client_t *client, 
                      unsigned long code,
                      const char *comment, const char *msg) {
   char buf[256];
   int len;

   len = snprintf(buf, 256,
                  "HTTP/1.0 %lu %s\r\nConnection: close\r\n\r\n%s\r\n", 
                  code, comment, msg);
   write(client->fd, buf, len);
}